

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineTimestampTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::TransferTestInstance::configCommandBuffer(TransferTestInstance *this)

{
  VkPipelineStageFlagBits VVar1;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  bool bVar4;
  VkResult VVar5;
  VkCommandBufferInheritanceInfo *pVVar6;
  VkCommandBuffer_s **ppVVar7;
  Handle<(vk::HandleType)8> *pHVar8;
  Handle<(vk::HandleType)9> *pHVar9;
  Handle<(vk::HandleType)11> *pHVar10;
  reference pVVar11;
  Move<vk::VkCommandBuffer_s_*> *this_00;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_3c0;
  __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
  local_3b8;
  const_iterator it;
  deUint32 timestampEntry;
  VkImageResolve imageResolve;
  undefined8 local_2fc;
  deUint32 data [3];
  undefined8 local_2e0;
  VkClearDepthStencilValue clearDSValue;
  VkImageBlit imageBlt;
  VkBufferImageCopy imgBufferCopy;
  VkBufferImageCopy bufImageCopy;
  VkImageCopy copyImageRegion;
  undefined8 local_158;
  VkBufferCopy copyBufRegion;
  VkOffset3D imageOffset;
  VkExtent3D imageExtent;
  VkOffset3D nullOffset;
  VkImageSubresourceLayers imgSubResCopy;
  VkImageSubresourceRange subRangeDepth;
  VkImageSubresourceRange subRangeColor;
  undefined8 uStack_68;
  VkClearColorValue dstClearValue;
  VkClearColorValue srcClearValue;
  deUint64 local_40;
  undefined8 uStack_38;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  DeviceInterface *vk;
  TransferTestInstance *this_local;
  
  pVVar6 = (VkCommandBufferInheritanceInfo *)
           Context::getDeviceInterface
                     ((this->super_TimestampTestInstance).super_TestInstance.m_context);
  cmdBufferBeginInfo.pNext = (void *)0x0;
  cmdBufferBeginInfo.flags = 0;
  cmdBufferBeginInfo._20_4_ = 0;
  uStack_38 = 0x2a;
  cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  cmdBufferBeginInfo._4_4_ = 0;
  this_00 = &(this->super_TimestampTestInstance).m_cmdBuffer;
  cmdBufferBeginInfo.pInheritanceInfo = pVVar6;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (*(*(_func_int ***)pVVar6)[0x49])(pVVar6,*ppVVar7,&uStack_38);
  ::vk::checkResult(VVar5,"vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x77c);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  local_40 = pHVar8->m_internal;
  (**(code **)(*(long *)pVVar6 + 0x328))(pVVar6,pVVar2,local_40,0,this->m_bufSize);
  dstClearValue._8_8_ = 0x3f8000003f800000;
  srcClearValue._0_8_ = 0x3f8000003f800000;
  uStack_68 = 0;
  dstClearValue._0_8_ = 0;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
            (this,pVVar2,pHVar9->m_internal);
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
            (this,pVVar2,pHVar9->m_internal,1);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (**(code **)(*(long *)pVVar6 + 0x330))
            (pVVar6,pVVar2,pHVar9->m_internal,1,dstClearValue.float32 + 2);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  (**(code **)(*(long *)pVVar6 + 0x330))(pVVar6,pVVar2,pHVar9->m_internal,1,&uStack_68);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&this_00->super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar2 = *ppVVar7;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      (&(this->super_TimestampTestInstance).m_queryPool.
                        super_RefBase<vk::Handle<(vk::HandleType)11>_>);
  (**(code **)(*(long *)pVVar6 + 0x380))(pVVar6,pVVar2,pHVar10->m_internal,0,8);
  pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
  copyBufRegion.size._0_4_ = this->m_imageWidth;
  copyBufRegion.size._4_4_ = this->m_imageHeight;
  switch(this->m_method) {
  case TRANSFER_METHOD_COPY_BUFFER:
    local_158 = 0;
    copyBufRegion.srcOffset = 0;
    copyBufRegion.dstOffset = 0x200;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    dVar3 = pHVar8->m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    (**(code **)(*(long *)pVVar6 + 0x2f8))(pVVar6,pVVar2,dVar3,pHVar8->m_internal,1,&local_158);
    break;
  case TRANSFER_METHOD_COPY_IMAGE:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    dVar3 = pHVar9->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x300))(pVVar6,pVVar2,dVar3,1,pHVar9->m_internal);
    break;
  case TRANSFER_METHOD_BLIT_IMAGE:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    dVar3 = pHVar9->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x308))(pVVar6,pVVar2,dVar3,1,pHVar9->m_internal);
    break;
  case TRANSFER_METHOD_COPY_BUFFER_TO_IMAGE:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_srcBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    dVar3 = pHVar8->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x310))(pVVar6,pVVar2,dVar3,pHVar9->m_internal,1);
    break;
  case TRANSFER_METHOD_COPY_IMAGE_TO_BUFFER:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_srcImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    dVar3 = pHVar9->m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    (**(code **)(*(long *)pVVar6 + 0x318))(pVVar6,pVVar2,dVar3,1,pHVar8->m_internal);
    break;
  case TRANSFER_METHOD_UPDATE_BUFFER:
    local_2fc = 0xabcdef00deadbeef;
    data[0] = 0x12345678;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    (**(code **)(*(long *)pVVar6 + 800))(pVVar6,pVVar2,pHVar8->m_internal,0x10,0xc,&local_2fc);
    break;
  case TRANSFER_METHOD_FILL_BUFFER:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    data._4_8_ = pHVar8->m_internal;
    (**(code **)(*(long *)pVVar6 + 0x328))(pVVar6,pVVar2,data._4_8_,0,this->m_bufSize,0);
    break;
  case TRANSFER_METHOD_CLEAR_COLOR_IMAGE:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x330))
              (pVVar6,pVVar2,pHVar9->m_internal,1,dstClearValue.float32 + 2);
    break;
  case TRANSFER_METHOD_CLEAR_DEPTH_STENCIL_IMAGE:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    clearDSValue.depth = 2.8026e-45;
    clearDSValue.stencil = 0;
    (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
              (this,pVVar2,pHVar9->m_internal,1);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    local_2e0 = 0x3f800000;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x338))(pVVar6,pVVar2,pHVar9->m_internal,1,&local_2e0);
    break;
  case TRANSFER_METHOD_RESOLVE_IMAGE:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (*(this->super_TimestampTestInstance).super_TestInstance._vptr_TestInstance[5])
              (this,pVVar2,pHVar9->m_internal,1);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x330))
              (pVVar6,pVVar2,pHVar9->m_internal,1,dstClearValue.float32 + 2);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_msImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    dVar3 = pHVar9->m_internal;
    pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    (**(code **)(*(long *)pVVar6 + 0x348))(pVVar6,pVVar2,dVar3,1,pHVar9->m_internal);
    break;
  case TRANSFER_METHOD_COPY_QUERY_POOL_RESULTS:
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        (&(this->super_TimestampTestInstance).m_queryPool.
                          super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    (**(code **)(*(long *)pVVar6 + 0x388))(pVVar6,pVVar2,1,pHVar10->m_internal,0);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        (&(this->super_TimestampTestInstance).m_queryPool.
                          super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    dVar3 = pHVar10->m_internal;
    pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                       (&(this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>);
    (**(code **)(*(long *)pVVar6 + 0x390))(pVVar6,pVVar2,dVar3,0,1,pHVar8->m_internal);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        (&(this->super_TimestampTestInstance).m_queryPool.
                          super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    (**(code **)(*(long *)pVVar6 + 0x380))(pVVar6,pVVar2,pHVar10->m_internal,0,1);
  }
  it._M_current._4_4_ = 0;
  local_3b8._M_current =
       (VkPipelineStageFlagBits *)
       std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::begin
                 (&(this->super_TimestampTestInstance).m_stages);
  while( true ) {
    local_3c0._M_current =
         (VkPipelineStageFlagBits *)
         std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>::end
                   (&(this->super_TimestampTestInstance).m_stages);
    bVar4 = __gnu_cxx::operator!=(&local_3b8,&local_3c0);
    pVVar6 = cmdBufferBeginInfo.pInheritanceInfo;
    if (!bVar4) break;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        (&(this->super_TimestampTestInstance).m_cmdBuffer.
                          super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar2 = *ppVVar7;
    pVVar11 = __gnu_cxx::
              __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
              ::operator*(&local_3b8);
    VVar1 = *pVVar11;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                        (&(this->super_TimestampTestInstance).m_queryPool.
                          super_RefBase<vk::Handle<(vk::HandleType)11>_>);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
    (**(code **)(*(long *)pVVar6 + 0x388))(pVVar6,pVVar2,VVar1,pHVar10->m_internal);
    __gnu_cxx::
    __normal_iterator<const_vk::VkPipelineStageFlagBits_*,_std::vector<vk::VkPipelineStageFlagBits,_std::allocator<vk::VkPipelineStageFlagBits>_>_>
    ::operator++(&local_3b8,0);
  }
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      (&(this->super_TimestampTestInstance).m_cmdBuffer.
                        super_RefBase<vk::VkCommandBuffer_s_*>);
  VVar5 = (**(code **)(*(long *)pVVar6 + 0x250))(pVVar6,*ppVVar7);
  ::vk::checkResult(VVar5,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineTimestampTests.cpp"
                    ,0x836);
  return;
}

Assistant:

void TransferTestInstance::configCommandBuffer(void)
{
	const DeviceInterface&      vk                  = m_context.getDeviceInterface();

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,    // VkStructureType                  sType;
		DE_NULL,                                        // const void*                      pNext;
		0u,                                             // VkCmdBufferOptimizeFlags         flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	VK_CHECK(vk.beginCommandBuffer(*m_cmdBuffer, &cmdBufferBeginInfo));

	// Initialize buffer/image
	vk.cmdFillBuffer(*m_cmdBuffer, *m_dstBuffer, 0u, m_bufSize, 0x0);

	const VkClearColorValue srcClearValue =
	{
		{1.0f, 1.0f, 1.0f, 1.0f}
	};
	const VkClearColorValue dstClearValue =
	{
		{0.0f, 0.0f, 0.0f, 0.0f}
	};
	const struct VkImageSubresourceRange subRangeColor =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,  // VkImageAspectFlags  aspectMask;
		0u,                         // deUint32            baseMipLevel;
		1u,                         // deUint32            mipLevels;
		0u,                         // deUint32            baseArrayLayer;
		1u,                         // deUint32            arraySize;
	};
	const struct VkImageSubresourceRange subRangeDepth =
	{
		VK_IMAGE_ASPECT_DEPTH_BIT,  // VkImageAspectFlags  aspectMask;
		0u,                  // deUint32            baseMipLevel;
		1u,                  // deUint32            mipLevels;
		0u,                  // deUint32            baseArrayLayer;
		1u,                  // deUint32            arraySize;
	};

	initialImageTransition(*m_cmdBuffer, *m_srcImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);
	initialImageTransition(*m_cmdBuffer, *m_dstImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);

	vk.cmdClearColorImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
	vk.cmdClearColorImage(*m_cmdBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, &dstClearValue, 1u, &subRangeColor);

	vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, TimestampTest::ENTRY_COUNT);

	// Copy Operations
	const VkImageSubresourceLayers imgSubResCopy =
	{
		VK_IMAGE_ASPECT_COLOR_BIT,              // VkImageAspectFlags  aspectMask;
		0u,                                     // deUint32            mipLevel;
		0u,                                     // deUint32            baseArrayLayer;
		1u,                                     // deUint32            layerCount;
	};

	const VkOffset3D nullOffset  = {0u, 0u, 0u};
	const VkExtent3D imageExtent = {(deUint32)m_imageWidth, (deUint32)m_imageHeight, 1u};
	const VkOffset3D imageOffset = {(int)m_imageWidth, (int)m_imageHeight, 1};
	switch(m_method)
	{
		case TRANSFER_METHOD_COPY_BUFFER:
			{
				const VkBufferCopy  copyBufRegion =
				{
					0u,      // VkDeviceSize    srcOffset;
					0u,      // VkDeviceSize    destOffset;
					512u,    // VkDeviceSize    copySize;
				};
				vk.cmdCopyBuffer(*m_cmdBuffer, *m_srcBuffer, *m_dstBuffer, 1u, &copyBufRegion);
				break;
			}
		case TRANSFER_METHOD_COPY_IMAGE:
			{
				const VkImageCopy copyImageRegion =
				{
					imgSubResCopy,                          // VkImageSubresourceCopy  srcSubresource;
					nullOffset,                             // VkOffset3D              srcOffset;
					imgSubResCopy,                          // VkImageSubresourceCopy  destSubresource;
					nullOffset,                             // VkOffset3D              destOffset;
					imageExtent,                            // VkExtent3D              extent;

				};
				vk.cmdCopyImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &copyImageRegion);
				break;
			}
		case TRANSFER_METHOD_COPY_BUFFER_TO_IMAGE:
			{
				const VkBufferImageCopy bufImageCopy =
				{
					0u,                                     // VkDeviceSize            bufferOffset;
					(deUint32)m_imageWidth,                 // deUint32                bufferRowLength;
					(deUint32)m_imageHeight,                // deUint32                bufferImageHeight;
					imgSubResCopy,                          // VkImageSubresourceCopy  imageSubresource;
					nullOffset,                             // VkOffset3D              imageOffset;
					imageExtent,                            // VkExtent3D              imageExtent;
				};
				vk.cmdCopyBufferToImage(*m_cmdBuffer, *m_srcBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &bufImageCopy);
				break;
			}
		case TRANSFER_METHOD_COPY_IMAGE_TO_BUFFER:
			{
				const VkBufferImageCopy imgBufferCopy =
				{
					0u,                                     // VkDeviceSize            bufferOffset;
					(deUint32)m_imageWidth,                 // deUint32                bufferRowLength;
					(deUint32)m_imageHeight,                // deUint32                bufferImageHeight;
					imgSubResCopy,                          // VkImageSubresourceCopy  imageSubresource;
					nullOffset,                             // VkOffset3D              imageOffset;
					imageExtent,                            // VkExtent3D              imageExtent;
				};
				vk.cmdCopyImageToBuffer(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstBuffer, 1u, &imgBufferCopy);
				break;
			}
		case TRANSFER_METHOD_BLIT_IMAGE:
			{
				const VkImageBlit imageBlt =
				{
					imgSubResCopy,                          // VkImageSubresourceCopy  srcSubresource;
					{
						nullOffset,
						imageOffset,
					},
					imgSubResCopy,                          // VkImageSubresourceCopy  destSubresource;
					{
						nullOffset,
						imageOffset,
					}
				};
				vk.cmdBlitImage(*m_cmdBuffer, *m_srcImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &imageBlt, VK_FILTER_NEAREST);
				break;
			}
		case TRANSFER_METHOD_CLEAR_COLOR_IMAGE:
			{
				vk.cmdClearColorImage(*m_cmdBuffer, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
				break;
			}
		case TRANSFER_METHOD_CLEAR_DEPTH_STENCIL_IMAGE:
			{
				initialImageTransition(*m_cmdBuffer, *m_depthImage, subRangeDepth, VK_IMAGE_LAYOUT_GENERAL);
				const VkClearDepthStencilValue clearDSValue =
				{
					1.0f,                                   // float       depth;
					0u,                                     // deUint32    stencil;
				};
				vk.cmdClearDepthStencilImage(*m_cmdBuffer, *m_depthImage, VK_IMAGE_LAYOUT_GENERAL, &clearDSValue, 1u, &subRangeDepth);
				break;
			}
		case TRANSFER_METHOD_FILL_BUFFER:
			{
				vk.cmdFillBuffer(*m_cmdBuffer, *m_dstBuffer, 0u, m_bufSize, 0x0);
				break;
			}
		case TRANSFER_METHOD_UPDATE_BUFFER:
			{
				const deUint32 data[] =
				{
					0xdeadbeef, 0xabcdef00, 0x12345678
				};
				vk.cmdUpdateBuffer(*m_cmdBuffer, *m_dstBuffer, 0x10, sizeof(data), data);
				break;
			}
		case TRANSFER_METHOD_COPY_QUERY_POOL_RESULTS:
			{
				vk.cmdWriteTimestamp(*m_cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, *m_queryPool, 0u);
				vk.cmdCopyQueryPoolResults(*m_cmdBuffer, *m_queryPool, 0u, 1u, *m_dstBuffer, 0u, 8u, VK_QUERY_RESULT_64_BIT | VK_QUERY_RESULT_WAIT_BIT);
				vk.cmdResetQueryPool(*m_cmdBuffer, *m_queryPool, 0u, 1u);
				break;
			}
		case TRANSFER_METHOD_RESOLVE_IMAGE:
			{
				const VkImageResolve imageResolve =
				{
					imgSubResCopy,                              // VkImageSubresourceLayers  srcSubresource;
					nullOffset,                                 // VkOffset3D                srcOffset;
					imgSubResCopy,                              // VkImageSubresourceLayers  destSubresource;
					nullOffset,                                 // VkOffset3D                destOffset;
					imageExtent,                                // VkExtent3D                extent;
				};
				initialImageTransition(*m_cmdBuffer, *m_msImage, subRangeColor, VK_IMAGE_LAYOUT_GENERAL);
				vk.cmdClearColorImage(*m_cmdBuffer, *m_msImage, VK_IMAGE_LAYOUT_GENERAL, &srcClearValue, 1u, &subRangeColor);
				vk.cmdResolveImage(*m_cmdBuffer, *m_msImage, VK_IMAGE_LAYOUT_GENERAL, *m_dstImage, VK_IMAGE_LAYOUT_GENERAL, 1u, &imageResolve);
				break;
			}
		default:
			DE_FATAL("Unknown Transfer Method!");
			break;
	};

	deUint32 timestampEntry = 0u;
	for (StageFlagVector::const_iterator it = m_stages.begin(); it != m_stages.end(); it++)
	{
		vk.cmdWriteTimestamp(*m_cmdBuffer, *it, *m_queryPool, timestampEntry++);
	}

	VK_CHECK(vk.endCommandBuffer(*m_cmdBuffer));
}